

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

field_t * SEM_VarDec(ast *node,attr *a,int ins)

{
  int iVar1;
  ast *paVar2;
  undefined4 *puVar3;
  void *pvVar4;
  int in_EDX;
  ast *in_RSI;
  ast *in_RDI;
  field_t *f;
  attr *a1;
  attr *sa;
  ast *child1;
  ast *local_30;
  undefined4 in_stack_ffffffffffffffe0;
  ast *paVar5;
  value *local_8;
  
  local_30 = in_RSI;
  paVar2 = child(in_RDI,1);
  if (paVar2->type == -0x2708) {
    puVar3 = (undefined4 *)malloc(0x10);
    iVar1 = (int)((ulong)paVar2 >> 0x20);
    *puVar3 = 1;
    pvVar4 = malloc(0x10);
    *(void **)(puVar3 + 2) = pvVar4;
    **(undefined8 **)(puVar3 + 2) = local_30;
    paVar2 = child(in_RDI,3);
    *(int *)(*(long *)(puVar3 + 2) + 8) = (int)paVar2->val->numval;
    local_8 = (value *)SEM_VarDec(local_30,(attr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),iVar1)
    ;
  }
  else {
    if ((((local_30->type == 2) &&
         (((anon_union_8_4_35def4f3_for_attr_1 *)&local_30->name)->structure->field ==
          (field_t *)0x0)) &&
        (((anon_union_8_4_35def4f3_for_attr_1 *)&local_30->name)->basic->name != (char *)0x0)) &&
       (paVar5 = local_30, local_30 = (ast *)findvar((char *)a1), local_30 == (ast *)0x0)) {
      local_30 = paVar5;
      semerror(0x11,(int)(ulong)(uint)in_RDI->pos->first_line,semErrorMsg[0x11],
               ((anon_union_8_4_35def4f3_for_attr_1 *)&paVar5->name)->basic->name);
    }
    if ((in_EDX != 0) && (iVar1 = insertvar((char *)a1,(attr *)f), iVar1 == 0)) {
      semerror(3,(int)(ulong)(uint)paVar2->pos->first_line,semErrorMsg[3],paVar2->val->numval);
    }
    local_8 = (value *)malloc(0x20);
    *(undefined4 *)(local_8 + 2) = 0;
    local_8[1].typeval = (char *)local_30;
    *local_8 = *paVar2->val;
    local_8[3].numval = 0;
  }
  return (field_t *)local_8;
}

Assistant:

static struct field_t* SEM_VarDec(struct ast *node, struct attr *a, int ins) {
    struct ast *child1 = child(node, 1);
    struct attr *sa = a;
    if (child1->type == VarDec) {
        struct attr *a1 = malloc(sizeof(struct attr));
        a1->kind = ARRAY;
        a1->array = malloc(sizeof(struct array_t));
        a1->array->type = a;
        a1->array->size = (int)child(node, 3)->val->numval;
        return SEM_VarDec(child1, a1, ins);
    }
    //DONETODO: error insert
    if (a->kind == STRUCTURE && a->structure->field == NULL && a->structure->name &&
        ((sa = findvar(a->structure->name)) == NULL)) {
//            printf("no such struct\n");
        SEMERROR(UndefinedStruct, node, a->structure->name);
        sa = a;
    }
    if (ins) {
        if (insertvar(child1->val->idval, sa) == 0)
            SEMERROR(RedefinedVariable, child1, child1->val->idval);
    }
    struct field_t *f = malloc(sizeof(struct field_t));
    f->isInit = 0;
    f->type = sa;
    f->name = child1->val->idval;
    f->next = NULL;
    return f;
}